

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

xmlStreamCtxtPtr xmlPatternGetStreamCtxt(xmlPatternPtr comp)

{
  xmlStreamCtxtPtr pxVar1;
  xmlStreamCtxtPtr pxVar2;
  xmlStreamCtxtPtr cur;
  xmlStreamCtxtPtr ret;
  xmlPatternPtr comp_local;
  
  cur = (xmlStreamCtxtPtr)0x0;
  if ((comp == (xmlPatternPtr)0x0) ||
     (ret = (xmlStreamCtxtPtr)comp, comp->stream == (xmlStreamCompPtr)0x0)) {
    comp_local = (xmlPatternPtr)0x0;
  }
  else {
    for (; ret != (xmlStreamCtxtPtr)0x0; ret = *(xmlStreamCtxtPtr *)&ret->nbState) {
      if ((ret[1].comp == (xmlStreamCompPtr)0x0) ||
         (pxVar2 = xmlNewStreamCtxt(ret[1].comp), pxVar2 == (xmlStreamCtxtPtr)0x0)) {
        xmlFreeStreamCtxt(cur);
        return (xmlStreamCtxtPtr)0x0;
      }
      pxVar1 = pxVar2;
      if (cur != (xmlStreamCtxtPtr)0x0) {
        pxVar2->next = cur->next;
        cur->next = pxVar2;
        pxVar1 = cur;
      }
      cur = pxVar1;
      pxVar2->flags = *(int *)&ret->states;
    }
    comp_local = (xmlPatternPtr)cur;
  }
  return (xmlStreamCtxtPtr)comp_local;
}

Assistant:

xmlStreamCtxtPtr
xmlPatternGetStreamCtxt(xmlPatternPtr comp)
{
    xmlStreamCtxtPtr ret = NULL, cur;

    if ((comp == NULL) || (comp->stream == NULL))
        return(NULL);

    while (comp != NULL) {
        if (comp->stream == NULL)
	    goto failed;
	cur = xmlNewStreamCtxt(comp->stream);
	if (cur == NULL)
	    goto failed;
	if (ret == NULL)
	    ret = cur;
	else {
	    cur->next = ret->next;
	    ret->next = cur;
	}
	cur->flags = comp->flags;
	comp = comp->next;
    }
    return(ret);
failed:
    xmlFreeStreamCtxt(ret);
    return(NULL);
}